

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void ReturnStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsVm *pJVar1;
  JsValue *res_00;
  undefined1 local_38 [8];
  JsValue r2;
  
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if (pJVar1->debug == 1) {
    pJVar1 = JsGetVm();
    if (pJVar1->trace != (JsVmTraceFn)0x0) {
      pJVar1 = JsGetVm();
      (*pJVar1->trace)(context->engine,na->location,JS_TRACE_STATEMENT);
    }
  }
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_38);
  res_00 = (JsValue *)JsMalloc(0x18);
  JsGetValue((JsValue *)local_38,res_00);
  res->type = JS_COMPLETION;
  (res->u).completion.type = JS_COMPLETION_RETURN;
  (res->u).completion.value = res_00;
  return;
}

Assistant:

static void
ReturnStatement_eval(na, context, res)
	struct JsAstNode *na; /* (struct ReturnStatement_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstReturnStatementNode *n = CAST_NODE(na, JsAstReturnStatementNode);
	struct JsValue r2, *v;

	TRACE(na->location, context, JS_TRACE_STATEMENT);
	EVAL(n->expr, context, &r2);
	v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	JsGetValue(&r2, v);
	JS_SET_COMPLETION(res, JS_COMPLETION_RETURN, v);
}